

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_bind.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  amqp_rpc_reply_t x;
  amqp_rpc_reply_t x_00;
  amqp_rpc_reply_t x_01;
  amqp_rpc_reply_t x_02;
  amqp_rpc_reply_t x_03;
  int iVar5;
  undefined4 uVar6;
  int x_04;
  undefined8 uVar7;
  long lVar8;
  undefined4 extraout_EDX;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 local_d0 [2];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0 [2];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70 [2];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50 [2];
  undefined8 local_40;
  undefined8 uStack_38;
  
  if (argc < 6) {
    main_cold_1();
    iVar5 = 1;
  }
  else {
    pcVar1 = argv[1];
    iVar5 = atoi(argv[2]);
    pcVar2 = argv[3];
    pcVar3 = argv[4];
    pcVar4 = argv[5];
    uVar7 = amqp_new_connection();
    lVar8 = amqp_tcp_socket_new(uVar7);
    if (lVar8 == 0) {
      die("creating TCP socket");
    }
    iVar5 = amqp_socket_open(lVar8,pcVar1,iVar5);
    if (iVar5 != 0) {
      die("opening TCP socket");
    }
    iVar5 = 0;
    amqp_login(local_50,uVar7,"/",0,0x20000,0,0,0x102063,"guest");
    x.reply.id = (int)local_50[1];
    x._0_8_ = local_50[0];
    x.reply._4_4_ = (int)((ulong)local_50[1] >> 0x20);
    x.reply.decoded = (void *)local_40;
    x._24_8_ = uStack_38;
    die_on_amqp_error(x,"Logging in");
    amqp_channel_open(uVar7,1);
    amqp_get_rpc_reply(local_70,uVar7);
    x_00.reply.id = (int)local_70[1];
    x_00._0_8_ = local_70[0];
    x_00.reply._4_4_ = (int)((ulong)local_70[1] >> 0x20);
    x_00.reply.decoded = (void *)local_60;
    x_00._24_8_ = uStack_58;
    die_on_amqp_error(x_00,"Opening channel");
    auVar9 = amqp_cstring_bytes(pcVar4);
    auVar10 = amqp_cstring_bytes(pcVar2);
    uVar6 = amqp_cstring_bytes(pcVar3);
    amqp_queue_bind(uVar7,1,auVar9._0_8_,auVar9._8_8_,auVar10._0_8_,auVar10._8_8_,uVar6,extraout_EDX
                    ,_amqp_empty_table,_putchar);
    amqp_get_rpc_reply(local_90,uVar7);
    x_01.reply.id = (int)local_90[1];
    x_01._0_8_ = local_90[0];
    x_01.reply._4_4_ = (int)((ulong)local_90[1] >> 0x20);
    x_01.reply.decoded = (void *)local_80;
    x_01._24_8_ = uStack_78;
    die_on_amqp_error(x_01,"Unbinding");
    amqp_channel_close(local_b0,uVar7,1,200);
    x_02.reply.id = (int)local_b0[1];
    x_02._0_8_ = local_b0[0];
    x_02.reply._4_4_ = (int)((ulong)local_b0[1] >> 0x20);
    x_02.reply.decoded = (void *)local_a0;
    x_02._24_8_ = uStack_98;
    die_on_amqp_error(x_02,"Closing channel");
    amqp_connection_close(local_d0,uVar7,200);
    x_03.reply.id = (int)local_d0[1];
    x_03._0_8_ = local_d0[0];
    x_03.reply._4_4_ = (int)((ulong)local_d0[1] >> 0x20);
    x_03.reply.decoded = (void *)local_c0;
    x_03._24_8_ = uStack_b8;
    die_on_amqp_error(x_03,"Closing connection");
    x_04 = amqp_destroy_connection(uVar7);
    die_on_error(x_04,"Ending connection");
  }
  return iVar5;
}

Assistant:

int main(int argc, char const *const *argv)
{
  char const *hostname;
  int port, status;
  char const *exchange;
  char const *bindingkey;
  char const *queue;
  amqp_socket_t *socket = NULL;
  amqp_connection_state_t conn;

  if (argc < 6) {
    fprintf(stderr, "Usage: amqp_bind host port exchange bindingkey queue\n");
    return 1;
  }

  hostname = argv[1];
  port = atoi(argv[2]);
  exchange = argv[3];
  bindingkey = argv[4];
  queue = argv[5];

  conn = amqp_new_connection();

  socket = amqp_tcp_socket_new(conn);
  if (!socket) {
    die("creating TCP socket");
  }

  status = amqp_socket_open(socket, hostname, port);
  if (status) {
    die("opening TCP socket");
  }

  die_on_amqp_error(amqp_login(conn, "/", 0, 131072, 0, AMQP_SASL_METHOD_PLAIN, "guest", "guest"),
                    "Logging in");
  amqp_channel_open(conn, 1);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Opening channel");

  amqp_queue_bind(conn, 1,
                  amqp_cstring_bytes(queue),
                  amqp_cstring_bytes(exchange),
                  amqp_cstring_bytes(bindingkey),
                  amqp_empty_table);
  die_on_amqp_error(amqp_get_rpc_reply(conn), "Unbinding");

  die_on_amqp_error(amqp_channel_close(conn, 1, AMQP_REPLY_SUCCESS), "Closing channel");
  die_on_amqp_error(amqp_connection_close(conn, AMQP_REPLY_SUCCESS), "Closing connection");
  die_on_error(amqp_destroy_connection(conn), "Ending connection");
  return 0;
}